

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

void __thiscall cfd::TransactionContext::Verify(TransactionContext *this,OutPoint *outpoint)

{
  AbstractTxIn *pAVar1;
  OutPoint *outpoint_00;
  bool bVar2;
  uint uVar3;
  uint32_t vout;
  CfdException *pCVar4;
  TransactionContext *this_00;
  AbstractTxIn *this_01;
  allocator local_b29;
  OutPoint *local_b28;
  AbstractTxIn *local_b20;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxo_list;
  Script local_b00;
  undefined1 local_ac8 [32];
  OutPoint target_outpoint;
  UtxoData work_utxo;
  UtxoData utxo;
  
  UtxoData::UtxoData(&utxo);
  local_b28 = outpoint;
  bVar2 = IsFindUtxoMap(this,outpoint,&utxo);
  if (!bVar2) {
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&work_utxo,"Utxo is not found. verify fail.",(allocator *)&local_b00);
    core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&work_utxo);
    __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  uVar3 = (*(this->super_Transaction).super_AbstractTransaction._vptr_AbstractTransaction[0xf])
                    (this,local_b28);
  local_b20 = &(this->super_Transaction).vin_.
               super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
               super__Vector_impl_data._M_start[uVar3].super_AbstractTxIn;
  utxo_list.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  utxo_list.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  utxo_list.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetLockingScriptFromUtxoData((Script *)&work_utxo,&utxo);
  core::Script::operator=(&utxo.locking_script,(Script *)&work_utxo);
  core::Script::~Script((Script *)&work_utxo);
  bVar2 = core::Script::IsTaprootScript(&utxo.locking_script);
  if (bVar2) {
    UtxoData::UtxoData(&work_utxo);
    pAVar1 = &((this->super_Transaction).vin_.
               super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
               super__Vector_impl_data._M_finish)->super_AbstractTxIn;
    for (this_01 = &((this->super_Transaction).vin_.
                     super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_AbstractTxIn; this_01 != pAVar1;
        this_01 = this_01 + 1) {
      core::AbstractTxIn::GetTxid((Txid *)&local_b00,this_01);
      vout = core::AbstractTxIn::GetVout(this_01);
      core::OutPoint::OutPoint(&target_outpoint,(Txid *)&local_b00,vout);
      core::Txid::~Txid((Txid *)&local_b00);
      bVar2 = IsFindUtxoMap(this,&target_outpoint,&work_utxo);
      if (!bVar2) {
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&local_b00,"Utxo is not found. Verify fail.",&local_b29);
        core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&local_b00);
        __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      GetLockingScriptFromUtxoData(&local_b00,&work_utxo);
      core::Script::operator=(&work_utxo.locking_script,&local_b00);
      core::Script::~Script(&local_b00);
      std::vector<cfd::UtxoData,std::allocator<cfd::UtxoData>>::emplace_back<cfd::UtxoData&>
                ((vector<cfd::UtxoData,std::allocator<cfd::UtxoData>> *)&utxo_list,&work_utxo);
      core::Txid::~Txid(&target_outpoint.txid_);
    }
    UtxoData::~UtxoData(&work_utxo);
  }
  outpoint_00 = local_b28;
  local_ac8._8_8_ = 0;
  local_ac8._0_8_ = CreateTxSighash;
  local_ac8._24_8_ =
       std::
       _Function_handler<cfd::core::ByteData256_(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*),_cfd::core::ByteData256_(*)(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
       ::_M_invoke;
  local_ac8._16_8_ =
       std::
       _Function_handler<cfd::core::ByteData256_(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*),_cfd::core::ByteData256_(*)(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
       ::_M_manager;
  TransactionContextUtil::Verify<cfd::TransactionContext>
            (this,local_b28,&utxo,local_b20,
             (function<cfd::core::ByteData256_(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
              *)local_ac8);
  this_00 = (TransactionContext *)local_ac8;
  std::_Function_base::~_Function_base((_Function_base *)this_00);
  bVar2 = IsFindOutPoint(this_00,&this->verify_map_,outpoint_00);
  if (!bVar2) {
    std::vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>>::
    emplace_back<cfd::core::OutPoint_const&>
              ((vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>> *)&this->verify_map_
               ,local_b28);
  }
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&utxo_list);
  UtxoData::~UtxoData(&utxo);
  return;
}

Assistant:

void TransactionContext::Verify(const OutPoint& outpoint) {
  UtxoData utxo;
  if (!IsFindUtxoMap(outpoint, &utxo)) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Utxo is not found. verify fail.");
  }
  const auto& txin = vin_[GetTxInIndex(outpoint)];

  std::vector<UtxoData> utxo_list;
  utxo.locking_script = GetLockingScriptFromUtxoData(utxo);
  if (utxo.locking_script.IsTaprootScript()) {
    UtxoData work_utxo;
    for (const auto& txin_ref : vin_) {
      OutPoint target_outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
      if (!IsFindUtxoMap(target_outpoint, &work_utxo)) {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Utxo is not found. Verify fail.");
      }
      work_utxo.locking_script = GetLockingScriptFromUtxoData(work_utxo);
      utxo_list.emplace_back(work_utxo);
    }
  }
  TransactionContextUtil::Verify<TransactionContext>(
      this, outpoint, utxo, &txin, CreateTxSighash);
  if (!IsFindOutPoint(verify_map_, outpoint)) {
    verify_map_.emplace_back(outpoint);
  }
}